

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

void __thiscall
duckdb::FSSTCompressionState::CreateEmptySegment(FSSTCompressionState *this,idx_t row_start)

{
  CompressionFunction *function;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> __p;
  DatabaseInstance *db;
  LogicalType *type;
  idx_t segment_size;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
  compressed_segment;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_38;
  
  db = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  type = ColumnDataCheckpointData::GetType(this->checkpoint_data);
  function = this->function;
  segment_size = CompressionInfo::GetBlockSize(&(this->super_CompressionState).info);
  ColumnSegment::CreateTransientSegment
            ((ColumnSegment *)&stack0xffffffffffffffc8,db,function,type,row_start,segment_size,
             (this->super_CompressionState).info.block_manager);
  __p._M_t.super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
  ._M_t.super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
  .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true,_true>
        )(__uniq_ptr_data<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true,_true>
          )local_38._M_head_impl;
  local_38._M_head_impl = (ColumnSegment *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::reset
            ((__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             &this->current_segment,
             (pointer)__p._M_t.
                      super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
                      .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl);
  Reset(this);
  ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             &stack0xffffffffffffffc8);
  return;
}

Assistant:

void CreateEmptySegment(idx_t row_start) {
		auto &db = checkpoint_data.GetDatabase();
		auto &type = checkpoint_data.GetType();

		auto compressed_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start,
		                                                                info.GetBlockSize(), info.GetBlockManager());
		current_segment = std::move(compressed_segment);
		Reset();
	}